

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  reference pvVar4;
  uint64_t uVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  ExamResults *in_stack_00000008;
  size_t i;
  uint64_t s;
  SolutionCollection solutions;
  ExamResults examResults;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  istream *in_stack_00000808;
  char *in_stack_fffffffffffffeb8;
  ExamResults *in_stack_fffffffffffffec0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffed0;
  allocator_type *in_stack_fffffffffffffee8;
  char **in_stack_fffffffffffffef0;
  char **in_stack_fffffffffffffef8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  ulong local_90;
  SolutionCollection local_80 [2];
  int local_48;
  undefined4 local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  int local_4;
  
  local_4 = 0;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x105d5a);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x105d8e);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  if (sVar2 < 2) {
    InferExamAnswers::Parser::getExamResults(in_stack_00000808);
    InferExamAnswers::Algorithm::runAlgorithm(in_stack_00000008);
    uVar5 = InferExamAnswers::SolutionCollection::getSize(local_80);
    if (uVar5 == 1) {
      pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)InferExamAnswers::SolutionCollection::getSolution(local_80);
      in_stack_fffffffffffffed0 = pvVar6;
      for (local_90 = 0; local_90 < (byte)local_48; local_90 = local_90 + 1) {
        std::ostream::operator<<
                  ((ostream *)&std::cout,
                   (ulong)(((ulong)pvVar6 >> ((ulong)(~(uint)local_90 + local_48) & 0x3f) & 1) != 0)
                  );
      }
    }
    else {
      uVar5 = InferExamAnswers::SolutionCollection::getSize(local_80);
      in_stack_fffffffffffffec0 =
           (ExamResults *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
      std::operator<<((ostream *)in_stack_fffffffffffffec0," solutions");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    local_40 = 1;
    InferExamAnswers::SolutionCollection::~SolutionCollection(local_80);
    InferExamAnswers::ExamResults::~ExamResults(in_stack_fffffffffffffec0);
    goto LAB_001061bd;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (bVar1) {
LAB_00105e31:
    printVersion();
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (bVar1) goto LAB_00105e31;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,"unknown options: \"");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        poVar3 = std::operator<<(poVar3,(string *)pvVar4);
        poVar3 = std::operator<<(poVar3,"\"");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
        printHelp((string *)0x105fc7);
        local_4 = 1;
        local_40 = 1;
        goto LAB_001061bd;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8);
    printHelp((string *)0x105f12);
  }
  local_4 = 0;
  local_40 = 1;
LAB_001061bd:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffed0);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
	// Because ptr arithmatic is not allowed but we need it here
	// to access program arguments we explicitly NOLINT here.
	std::vector<std::string> arguments(argv, argv + argc); // NOLINT

	if (arguments.size() >= 2) {
		if (arguments.at(1) == "--version" || arguments.at(1) == "-v") {
			printVersion();
		} else if (arguments.at(1) == "--help" || arguments.at(1) == "-h") {
			printHelp(arguments.at(0));
		} else {
			std::cout << "unknown options: \"" << arguments.at(1) << "\"" << std::endl << std::endl;
			printHelp(arguments.at(0));
			return EXIT_FAILURE;
		}
		return EXIT_SUCCESS;
	}

	const auto examResults = InferExamAnswers::Parser::getExamResults(std::cin);

	const auto solutions = InferExamAnswers::Algorithm::runAlgorithm(examResults);

	if (solutions.getSize() == 1) {
		const auto s = solutions.getSolution();
		for (size_t i = 0; i < examResults.questionCount; ++i) {
			std::cout << ((s >> (examResults.questionCount - i - 1)) & 1U);
		}
	} else {
		std::cout << solutions.getSize() << " solutions";
	}

	std::cout << std::endl;

	return EXIT_SUCCESS;
}